

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

Message __thiscall Client::Receive(Client *this)

{
  Message MVar1;
  ssize_t sVar2;
  long lStack_28;
  Message msg;
  
  lStack_28 = 0;
  msg.scalar1 = 0;
  sVar2 = recv(this->sockfd,&lStack_28,0x10,0);
  this->n = (int)sVar2;
  if ((int)sVar2 < 0) {
    puts("ERROR reading from client socket in Alice!");
  }
  else {
    (this->msg_from_server).scalar1 = lStack_28;
    (this->msg_from_server).scalar2 = msg.scalar1;
  }
  MVar1.scalar2 = msg.scalar1;
  MVar1.scalar1 = lStack_28;
  return MVar1;
}

Assistant:

const Message Client::Receive()
{
    Message msg;
    n = recv(sockfd, &msg, sizeof(msg), 0);
    if (n < 0)
        printf("ERROR reading from client socket in Alice!\n");
    else
        msg_from_server = msg;
  
    return msg;
}